

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O0

float orient2dslow(float *pa,float *pb,float *pc)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float _2;
  float _1;
  float _0;
  float _n;
  float _m;
  float _l;
  float _k;
  float _j;
  float _i;
  float err3;
  float err2;
  float err1;
  float blo;
  float bhi;
  float a1lo;
  float a1hi;
  float a0lo;
  float a0hi;
  float abig;
  float c;
  float around;
  float bround;
  float avirt;
  float bvirt;
  int deterlen;
  float deter [16];
  float bxay7;
  float axby7;
  float bxay [8];
  float axby [8];
  float negatetail;
  float negate;
  float bcytail;
  float bcxtail;
  float acytail;
  float acxtail;
  float bcy;
  float bcx;
  float acy;
  float acx;
  float *pc_local;
  float *pb_local;
  float *pa_local;
  
  fVar2 = *pa - *pc;
  fVar3 = (*pa - (fVar2 + (*pa - fVar2))) + ((*pa - fVar2) - *pc);
  fVar4 = pa[1] - pc[1];
  fVar5 = *pb - *pc;
  fVar6 = (*pb - (fVar5 + (*pb - fVar5))) + ((*pb - fVar5) - *pc);
  fVar7 = pb[1] - pc[1];
  fVar8 = (pb[1] - (fVar7 + (pb[1] - fVar7))) + ((pb[1] - fVar7) - pc[1]);
  fVar9 = splitter * fVar3 - (splitter * fVar3 - fVar3);
  fVar10 = fVar3 - fVar9;
  fVar11 = splitter * fVar8 - (splitter * fVar8 - fVar8);
  fVar12 = fVar8 - fVar11;
  fVar13 = fVar3 * fVar8;
  bxay[6] = fVar10 * fVar12 + -(-fVar9 * fVar12 + -fVar10 * fVar11 + -fVar9 * fVar11 + fVar13);
  fVar14 = splitter * fVar2 - (splitter * fVar2 - fVar2);
  fVar2 = (fVar2 - fVar14) * fVar12 +
          -(-fVar14 * fVar12 + -(fVar2 - fVar14) * fVar11 + -fVar14 * fVar11 + fVar2 * fVar8);
  fVar8 = fVar13 + fVar2;
  fVar11 = fVar8 - fVar13;
  fVar2 = (fVar13 - (fVar8 - fVar11)) + (fVar2 - fVar11);
  fVar8 = splitter * fVar7 - (splitter * fVar7 - fVar7);
  fVar3 = fVar10 * (fVar7 - fVar8) +
          -(-fVar9 * (fVar7 - fVar8) + -fVar10 * fVar8 + -fVar9 * fVar8 + fVar3 * fVar7);
  fVar7 = fVar2 + fVar3;
  fVar8 = fVar7 - fVar2;
  bxay[7] = (fVar2 - (fVar7 - fVar8)) + (fVar3 - fVar8);
  fVar2 = -fVar4;
  fVar3 = -((pa[1] - (fVar4 + (pa[1] - fVar4))) + ((pa[1] - fVar4) - pc[1]));
  fVar4 = splitter * fVar6 - (splitter * fVar6 - fVar6);
  fVar7 = fVar6 - fVar4;
  fVar8 = splitter * fVar3 - (splitter * fVar3 - fVar3);
  fVar9 = fVar3 - fVar8;
  fVar10 = fVar6 * fVar3;
  bxay7 = fVar7 * fVar9 + -(-fVar4 * fVar9 + -fVar7 * fVar8 + -fVar4 * fVar8 + fVar10);
  fVar11 = splitter * fVar5 - (splitter * fVar5 - fVar5);
  fVar12 = fVar5 - fVar11;
  fVar3 = fVar5 * fVar3;
  fVar8 = fVar12 * fVar9 + -(-fVar11 * fVar9 + -fVar12 * fVar8 + -fVar11 * fVar8 + fVar3);
  fVar13 = fVar10 + fVar8;
  fVar8 = (fVar10 - (fVar13 - (fVar13 - fVar10))) + (fVar8 - (fVar13 - fVar10));
  fVar9 = fVar3 + fVar13;
  fVar13 = fVar13 - (fVar9 - fVar3);
  fVar3 = splitter * fVar2 - (splitter * fVar2 - fVar2);
  fVar10 = fVar2 - fVar3;
  fVar6 = fVar6 * fVar2;
  fVar4 = fVar7 * fVar10 + -(-fVar4 * fVar10 + -fVar7 * fVar3 + -fVar4 * fVar3 + fVar6);
  fVar7 = fVar8 + fVar4;
  axby7 = (fVar8 - (fVar7 - (fVar7 - fVar8))) + (fVar4 - (fVar7 - fVar8));
  fVar4 = fVar13 + fVar7;
  fVar7 = (fVar13 - (fVar4 - (fVar4 - fVar13))) + (fVar7 - (fVar4 - fVar13));
  fVar8 = fVar9 + fVar4;
  fVar4 = (fVar9 - (fVar8 - (fVar8 - fVar9))) + (fVar4 - (fVar8 - fVar9));
  fVar5 = fVar5 * fVar2;
  fVar2 = fVar12 * fVar10 + -(-fVar11 * fVar10 + -fVar12 * fVar3 + -fVar11 * fVar3 + fVar5);
  fVar3 = fVar6 + fVar2;
  fVar2 = (fVar6 - (fVar3 - (fVar3 - fVar6))) + (fVar2 - (fVar3 - fVar6));
  fVar9 = fVar7 + fVar2;
  bxay[0] = (fVar7 - (fVar9 - (fVar9 - fVar7))) + (fVar2 - (fVar9 - fVar7));
  fVar2 = fVar4 + fVar9;
  fVar4 = (fVar4 - (fVar2 - (fVar2 - fVar4))) + (fVar9 - (fVar2 - fVar4));
  fVar7 = fVar8 + fVar2;
  fVar2 = (fVar8 - (fVar7 - (fVar7 - fVar8))) + (fVar2 - (fVar7 - fVar8));
  fVar8 = fVar5 + fVar3;
  fVar3 = (fVar5 - (fVar8 - (fVar8 - fVar5))) + (fVar3 - (fVar8 - fVar5));
  fVar9 = fVar4 + fVar3;
  bxay[1] = (fVar4 - (fVar9 - (fVar9 - fVar4))) + (fVar3 - (fVar9 - fVar4));
  fVar3 = fVar2 + fVar9;
  fVar2 = (fVar2 - (fVar3 - (fVar3 - fVar2))) + (fVar9 - (fVar3 - fVar2));
  fVar4 = fVar7 + fVar3;
  fVar3 = (fVar7 - (fVar4 - (fVar4 - fVar7))) + (fVar3 - (fVar4 - fVar7));
  fVar7 = fVar2 + fVar8;
  bxay[2] = (fVar2 - (fVar7 - (fVar7 - fVar2))) + (fVar8 - (fVar7 - fVar2));
  fVar2 = fVar3 + fVar7;
  bxay[3] = (fVar3 - (fVar2 - (fVar2 - fVar3))) + (fVar7 - (fVar2 - fVar3));
  bxay[5] = fVar4 + fVar2;
  bxay[4] = (fVar4 - (bxay[5] - (bxay[5] - fVar4))) + (fVar2 - (bxay[5] - fVar4));
  iVar1 = fast_expansion_sum_zeroelim(8,bxay + 6,8,&bxay7,&bvirt);
  return (&bvirt)[iVar1 + -1];
}

Assistant:

REAL orient2dslow(pa, pb, pc)
REAL *pa;
REAL *pb;
REAL *pc;
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail;
  REAL bcxtail, bcytail;
  REAL negate, negatetail;
  REAL axby[8], bxay[8];
  INEXACT REAL axby7, bxay7;
  REAL deter[16];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pc[0], acx, acxtail);
  Two_Diff(pa[1], pc[1], acy, acytail);
  Two_Diff(pb[0], pc[0], bcx, bcxtail);
  Two_Diff(pb[1], pc[1], bcy, bcytail);

  Two_Two_Product(acx, acxtail, bcy, bcytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -acy;
  negatetail = -acytail;
  Two_Two_Product(bcx, bcxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;

  deterlen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, deter);

  return deter[deterlen - 1];
}